

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O0

void __thiscall
wasm::HashStringifyWalker::visitExpression(HashStringifyWalker *this,Expression *curr)

{
  type *this_00;
  type_conflict1 *ptVar1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_true>,_bool>
  pVar3;
  type_conflict1 *inserted;
  type *it;
  pair<wasm::Expression_*const,_unsigned_int> local_38;
  pair<std::__detail::_Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_true>,_bool>
  local_28;
  Expression *local_18;
  Expression *curr_local;
  HashStringifyWalker *this_local;
  
  local_18 = curr;
  curr_local = (Expression *)this;
  std::pair<wasm::Expression_*const,_unsigned_int>::pair<wasm::Expression_*&,_unsigned_int_&,_true>
            (&local_38,&local_18,&this->nextVal);
  pVar3 = std::
          unordered_map<wasm::Expression_*,_unsigned_int,_wasm::StringifyHasher,_wasm::StringifyEquator,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
          ::insert(&this->exprToCounter,&local_38);
  local_28.first =
       pVar3.first.super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_true>
       ._M_cur;
  local_28.second = pVar3.second;
  this_00 = std::
            get<0ul,std::__detail::_Node_iterator<std::pair<wasm::Expression*const,unsigned_int>,false,true>,bool>
                      (&local_28);
  ptVar1 = std::
           get<1ul,std::__detail::_Node_iterator<std::pair<wasm::Expression*const,unsigned_int>,false,true>,bool>
                     (&local_28);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_true>::operator->
                     (this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->hashString,&ppVar2->second);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&this->exprs,&local_18);
  if ((*ptVar1 & 1U) != 0) {
    this->nextVal = this->nextVal + 1;
  }
  return;
}

Assistant:

void HashStringifyWalker::visitExpression(Expression* curr) {
  auto [it, inserted] = exprToCounter.insert({curr, nextVal});
  hashString.push_back(it->second);
  exprs.push_back(curr);
  if (inserted) {
    nextVal++;
  }
}